

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbe_x.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPBE_X>::eval_exc_unpolar_impl
               (double rho,double sigma,double *eps)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double t46;
  double t42;
  double t37;
  double t33;
  double t31;
  double t30;
  double t18;
  double t17;
  double t15;
  double t13;
  double t11;
  double t10;
  double t8;
  double t7;
  double t2;
  double t28;
  double t25;
  double t24;
  double t6;
  double t27;
  double t23;
  double t20;
  double t4;
  double t3;
  
  piecewise_functor_5<double>(false,-0.999999999999999,false,0.999999999999999,0.0);
  dVar1 = safe_math::cbrt<double>(9.18934433588551e-318);
  dVar2 = safe_math::cbrt<double>(9.18943820835822e-318);
  dVar1 = piecewise_functor_3<double>(false,dVar1 * 1e-15,dVar2 * 1.0);
  dVar2 = safe_math::cbrt<double>(9.18973958840219e-318);
  dVar1 = piecewise_functor_3<double>
                    ((double)(-(ulong)(in_XMM0_Qa * 0.5 <= 1e-32) & 0x3ff0000000000000) != 0.0,0.0,
                     dVar1 * -0.36927938319101117 * dVar2 *
                     ((1.0 - 0.804 / (((double)CONCAT44(in_XMM1_Db,in_XMM1_Da) * 0.08669247488762274
                                       * 1.5874010519681996 *
                                      ((1.0 / (dVar2 * dVar2)) / (in_XMM0_Qa * in_XMM0_Qa))) / 24.0
                                     + 0.804)) * 0.804 + 1.0));
  *in_RDI = dVar1 * 2.0;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar_impl( double rho, double sigma, double& eps ) {

    (void)(eps);
    constexpr double t3 = constants::m_cbrt_3;
    constexpr double t4 = constants::m_cbrt_pi;
    constexpr double t20 = constants::m_cbrt_6;
    constexpr double t23 = constants::m_cbrt_pi_sq;
    constexpr double t27 = constants::m_cbrt_2;
    constexpr double t6 = t3 / t4;
    constexpr double t24 = t23 * t23;
    constexpr double t25 = 0.1e1 / t24;
    constexpr double t28 = t27 * t27;


    const double t2 = rho / 0.2e1 <= dens_tol;
    const double t7 = 0.1e1 <= zeta_tol;
    const double t8 = zeta_tol - 0.1e1;
    const double t10 = piecewise_functor_5( t7, t8, t7, -t8, 0.0 );
    const double t11 = 0.1e1 + t10;
    const double t13 = safe_math::cbrt( zeta_tol );
    const double t15 = safe_math::cbrt( t11 );
    const double t17 = piecewise_functor_3( t11 <= zeta_tol, t13 * zeta_tol, t15 * t11 );
    const double t18 = safe_math::cbrt( rho );
    const double t30 = rho * rho;
    const double t31 = t18 * t18;
    const double t33 = 0.1e1 / t31 / t30;
    const double t37 = kappa + mu * t20 * t25 * sigma * t28 * t33 / 0.24e2;
    const double t42 = 0.1e1 + kappa * ( 0.1e1 - kappa / t37 );
    const double t46 = piecewise_functor_3( t2, 0.0, -0.3e1 / 0.8e1 * t6 * t17 * t18 * t42 );


    eps = 0.2e1 * t46;

  }